

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

bool __thiscall IR::ListOpnd::IsEqualInternal(ListOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  ListOpnd *this_00;
  ListOpndType *this_01;
  ListOpndType *opnd_00;
  int i;
  int i_00;
  
  if ((this->super_Opnd).m_kind != OpndKindList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x94d,"(m_kind == OpndKindList)","m_kind == OpndKindList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (opnd->m_kind == OpndKindList) {
    this_00 = Opnd::AsListOpnd(opnd);
    i_00 = 0;
    bVar2 = false;
    if (this_00->count == this->count) {
      do {
        bVar2 = this->count <= i_00;
        if (this->count <= i_00) {
          return bVar2;
        }
        this_01 = Item(this,i_00);
        opnd_00 = Item(this_00,i_00);
        bVar3 = Opnd::IsEqual(&this_01->super_Opnd,&opnd_00->super_Opnd);
        i_00 = i_00 + 1;
      } while (bVar3);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ListOpnd::IsEqualInternal(Opnd * opnd)
{
    Assert(m_kind == OpndKindList);
    if (!opnd->IsListOpnd())
    {
        return false;
    }
    ListOpnd* l2 = opnd->AsListOpnd();
    if (l2->Count() != Count())
    {
        return false;
    }
    for (int i = 0; i < Count(); ++i)
    {
        if (!Item(i)->IsEqual(l2->Item(i)))
        {
            return false;
        }
    }
    return true;
}